

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Minisat::Clause::Clause<Minisat::vec<Minisat::Lit>>
          (Clause *this,vec<Minisat::Lit> *ps,bool use_extra,bool learnt)

{
  Lit *pLVar1;
  ulong uVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  int i;
  long lVar6;
  
  uVar4 = (uint)CONCAT71(in_register_00000009,learnt);
  uVar2 = (ulong)(uVar4 * 4);
  uVar4 = (uint)CONCAT71(in_register_00000011,use_extra) | uVar4;
  uVar3 = (ulong)(uVar4 << 3);
  this->header = (anon_struct_8_10_eb538618_for_header)
                 ((ulong)this->header & 0xffffffffffffffe0 | uVar2 | uVar3);
  uVar5 = ps->sz;
  this->header = (anon_struct_8_10_eb538618_for_header)
                 ((ulong)uVar5 << 0x22 | uVar3 | uVar2 | 0x80000000);
  pLVar1 = ps->data;
  for (lVar6 = 0; lVar6 < ps->sz; lVar6 = lVar6 + 1) {
    *(int *)(&this[1].header.field_0x0 + lVar6 * 4) = pLVar1[lVar6].x;
  }
  if ((char)uVar4 != '\0') {
    if (!learnt) {
      uVar2 = (ulong)this->header >> 0x22;
      uVar5 = 0;
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        uVar5 = uVar5 | 1 << ((byte)(&this[1].header.field_0x0)[uVar3 * 4] >> 1 & 0x1f);
      }
      *(uint *)(&this[1].header.field_0x0 + uVar2 * 4) = uVar5;
      return;
    }
    *(undefined8 *)(&this[1].header.field_0x0 + (ulong)(uVar5 & 0x3fffffff) * 4) = 0;
  }
  return;
}

Assistant:

Clause(const V &ps, bool use_extra, bool learnt)
    {
        header.mark = 0;
        header.learnt = learnt;
        header.has_extra = learnt | use_extra;
        header.reloced = 0;
        header.size = ps.size();
        header.lbd = 0;
        header.S = 0;
        header.removable = 1;
        // simplify
        //
        header.simplified = 0;
        header.onQueue = 0;

        for (int i = 0; i < ps.size(); i++) data[i].lit = ps[i];

        if (header.has_extra) {
            if (header.learnt) {
                data[header.size].act = 0;
                data[header.size + 1].touched = 0;
            } else
                calcAbstraction();
        }
    }